

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_FABS(DisasContext_conflict1 *s,arg_rpr_esz *a)

{
  _Bool _Var1;
  arg_rpr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  _Var1 = do_zpz_ool(s,a,trans_FABS::fns[a->esz]);
  return _Var1;
}

Assistant:

static bool trans_FABS(DisasContext *s, arg_rpr_esz *a)
{
    static gen_helper_gvec_3 * const fns[4] = {
        NULL,
        gen_helper_sve_fabs_h,
        gen_helper_sve_fabs_s,
        gen_helper_sve_fabs_d
    };
    return do_zpz_ool(s, a, fns[a->esz]);
}